

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O0

bool __thiscall CoinStatsIndex::CustomAppend(CoinStatsIndex *this,BlockInfo *block)

{
  uint256 *puVar1;
  ConstevalFormatString<2U> fmt;
  ConstevalFormatString<2U> fmt_00;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  CAmount CVar6;
  uint256 **ppuVar7;
  pointer pDVar8;
  size_type sVar9;
  ulong uVar10;
  uint64_t uVar11;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict *value_00;
  long lVar12;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CAmount unclaimed_rewards;
  size_t j_1;
  value_type *tx_undo;
  CTxOut *out_1;
  uint32_t j;
  value_type *tx;
  size_t i;
  CBlockIndex *pindex;
  CAmount block_subsidy;
  CBlockUndo block_undo;
  uint256 out;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict value;
  COutPoint outpoint_1;
  Coin coin_1;
  COutPoint outpoint;
  Coin coin;
  uint256 expected_block_hash;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict read_out;
  undefined4 in_stack_fffffffffffffb38;
  uint32_t in_stack_fffffffffffffb3c;
  char *in_stack_fffffffffffffb40;
  MuHash3072 *in_stack_fffffffffffffb48;
  char *in_stack_fffffffffffffb50;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb58;
  char *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  undefined2 in_stack_fffffffffffffb6c;
  undefined1 in_stack_fffffffffffffb6e;
  undefined1 in_stack_fffffffffffffb6f;
  COutPoint *in_stack_fffffffffffffb70;
  MuHash3072 *in_stack_fffffffffffffb78;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict *in_stack_fffffffffffffb80;
  DBHashKey *in_stack_fffffffffffffb88;
  CDBWrapper *in_stack_fffffffffffffb90;
  LogFlags in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffbac;
  CBlockIndex *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  BlockManager *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  undefined8 in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc08;
  ulong local_3a8;
  uint local_38c;
  ulong local_380;
  bool local_32d;
  Level in_stack_fffffffffffffce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  long local_1d0;
  long local_178;
  char local_108 [32];
  limb_t local_c8;
  limb_t lStack_c0;
  limb_t local_b8;
  limb_t lStack_b0;
  limb_t local_8;
  
  local_8 = *(limb_t *)(in_FS_OFFSET + 0x28);
  CBlockUndo::CBlockUndo
            ((CBlockUndo *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  Params();
  CChainParams::GetConsensus
            ((CChainParams *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  CVar6 = GetBlockSubsidy((int)((ulong)in_stack_fffffffffffffb50 >> 0x20),
                          (Params *)in_stack_fffffffffffffb48);
  *(CAmount *)(in_RDI + 0x3d0) = CVar6 + *(long *)(in_RDI + 0x3d0);
  if (*(int *)(in_RSI + 0x10) < 1) {
    *(CAmount *)(in_RDI + 0x3d8) = CVar6 + *(long *)(in_RDI + 0x3d8);
    *(CAmount *)(in_RDI + 0x3f8) = CVar6 + *(long *)(in_RDI + 0x3f8);
  }
  else {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    CustomAppend::anon_class_16_2_f791057a::operator()
              ((anon_class_16_2_f791057a *)
               CONCAT17(in_stack_fffffffffffffb6f,
                        CONCAT16(in_stack_fffffffffffffb6e,
                                 CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68))));
    bVar2 = ::node::BlockManager::UndoReadFromDisk
                      (in_stack_fffffffffffffbc8,
                       (CBlockUndo *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                       in_stack_fffffffffffffbb8);
    if (!bVar2) {
      local_32d = false;
      goto LAB_00f9155a;
    }
    std::pair<uint256,_(anonymous_namespace)::DBVal>::
    pair<uint256,_(anonymous_namespace)::DBVal,_true>
              ((pair<uint256,_(anonymous_namespace)::DBVal>_conflict *)in_stack_fffffffffffffb48);
    std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator->
              ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    anon_unknown.dwarf_193474c::DBHeightKey::DBHeightKey
              ((DBHeightKey *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),0);
    uVar3 = CDBWrapper::
            Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                      (in_stack_fffffffffffffb90,(DBHeightKey *)in_stack_fffffffffffffb88,
                       in_stack_fffffffffffffb80);
    if (((uVar3 ^ 0xff) & 1) != 0) {
      local_32d = false;
      goto LAB_00f9155a;
    }
    ppuVar7 = inline_assertion_check<true,uint256_const*const&>
                        ((uint256 **)in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
                         CONCAT13(in_stack_fffffffffffffb6f,
                                  CONCAT12(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb6c)),
                         in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
    puVar1 = *ppuVar7;
    local_c8 = *(limb_t *)(puVar1->super_base_blob<256U>).m_data._M_elems;
    lStack_c0 = *(limb_t *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    local_b8 = *(limb_t *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    lStack_b0 = *(limb_t *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    uVar4 = ::operator!=((base_blob<256U> *)in_stack_fffffffffffffb48,
                         (base_blob<256U> *)in_stack_fffffffffffffb40);
    if ((bool)uVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffb40);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffb40);
      __str = local_108;
      in_stack_fffffffffffffb48 = (MuHash3072 *)&stack0xffffffffffffff18;
      in_stack_fffffffffffffb40 =
           "WARNING: previous block header belongs to unexpected block %s; expected %s\n";
      in_stack_fffffffffffffb38 = 2;
      logging_function._M_str._0_7_ = in_stack_fffffffffffffc08;
      logging_function._M_len = (size_t)ppuVar7;
      logging_function._M_str._7_1_ = uVar3;
      source_file._M_str._0_7_ = in_stack_fffffffffffffbf8;
      source_file._M_len = in_stack_fffffffffffffbf0;
      source_file._M_str._7_1_ = uVar4;
      fmt.fmt._7_1_ = in_stack_fffffffffffffbef;
      fmt.fmt._0_7_ = in_stack_fffffffffffffbe8;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (logging_function,source_file,in_stack_fffffffffffffbac,in_stack_fffffffffffffba0,
                 in_stack_fffffffffffffce0,fmt,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      pDVar8 = std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator->
                         ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
                          CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      anon_unknown.dwarf_193474c::DBHashKey::DBHashKey
                ((DBHashKey *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (uint256 *)0xf90b71);
      uVar5 = CDBWrapper::
              Read<(anonymous_namespace)::DBHashKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                        (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                         in_stack_fffffffffffffb80);
      if (((uVar5 ^ 0xff) & 1) != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffb58,__str);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffb58,__str);
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffb40);
        in_stack_fffffffffffffb38 = 4;
        logging_function_00._M_str._0_7_ = in_stack_fffffffffffffc08;
        logging_function_00._M_len = (size_t)ppuVar7;
        logging_function_00._M_str._7_1_ = uVar3;
        source_file_00._M_str._0_7_ = in_stack_fffffffffffffbf8;
        source_file_00._M_len = (size_t)pDVar8;
        source_file_00._M_str._7_1_ = uVar4;
        fmt_00.fmt._7_1_ = uVar5;
        fmt_00.fmt._0_7_ = in_stack_fffffffffffffbe8;
        LogPrintFormatInternal<char[13],std::__cxx11::string>
                  (logging_function_00,source_file_00,in_stack_fffffffffffffbac,
                   in_stack_fffffffffffffba0,in_stack_fffffffffffffce0,fmt_00,
                   (char (*) [13])in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        local_32d = false;
        goto LAB_00f9155a;
      }
    }
    if (*(long *)(in_RSI + 0x20) == 0) {
      __assert_fail("block.data",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/coinstatsindex.cpp"
                    ,0x94,"virtual bool CoinStatsIndex::CustomAppend(const interfaces::BlockInfo &)"
                   );
    }
    for (local_380 = 0;
        sVar9 = std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)),
        local_380 < sVar9; local_380 = local_380 + 1) {
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::at((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_fffffffffffffb48,(size_type)in_stack_fffffffffffffb40);
      bVar2 = IsBIP30Unspendable((CBlockIndex *)
                                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      if (bVar2) {
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        bVar2 = CTransaction::IsCoinBase((CTransaction *)in_stack_fffffffffffffb48);
        if (!bVar2) goto LAB_00f90e2e;
        *(CAmount *)(in_RDI + 0x3d8) = CVar6 + *(long *)(in_RDI + 0x3d8);
        *(CAmount *)(in_RDI + 0x400) = CVar6 + *(long *)(in_RDI + 0x400);
      }
      else {
LAB_00f90e2e:
        local_38c = 0;
        while( true ) {
          uVar10 = (ulong)local_38c;
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          sVar9 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          if (sVar9 <= uVar10) break;
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb48,
                     (size_type)in_stack_fffffffffffffb40);
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          CTransaction::IsCoinBase((CTransaction *)in_stack_fffffffffffffb48);
          Coin::Coin((Coin *)in_stack_fffffffffffffb48,(CTxOut *)in_stack_fffffffffffffb40,
                     in_stack_fffffffffffffb3c,SUB41((uint)in_stack_fffffffffffffb38 >> 0x18,0));
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          CTransaction::GetHash
                    ((CTransaction *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          COutPoint::COutPoint
                    ((COutPoint *)in_stack_fffffffffffffb48,(Txid *)in_stack_fffffffffffffb40,
                     in_stack_fffffffffffffb3c);
          bVar2 = CScript::IsUnspendable((CScript *)in_stack_fffffffffffffb40);
          if (bVar2) {
            *(long *)(in_RDI + 0x3d8) = local_178 + *(long *)(in_RDI + 0x3d8);
            *(long *)(in_RDI + 0x408) = local_178 + *(long *)(in_RDI + 0x408);
          }
          else {
            kernel::ApplyCoinHash
                      (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                       (Coin *)CONCAT17(in_stack_fffffffffffffb6f,
                                        CONCAT16(in_stack_fffffffffffffb6e,
                                                 CONCAT24(in_stack_fffffffffffffb6c,
                                                          in_stack_fffffffffffffb68))));
            std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
            bVar2 = CTransaction::IsCoinBase((CTransaction *)in_stack_fffffffffffffb48);
            if (bVar2) {
              *(long *)(in_RDI + 0x3f0) = local_178 + *(long *)(in_RDI + 0x3f0);
            }
            else {
              *(long *)(in_RDI + 1000) = local_178 + *(long *)(in_RDI + 1000);
            }
            *(long *)(in_RDI + 0x3b8) = *(long *)(in_RDI + 0x3b8) + 1;
            *(long *)(in_RDI + 0x3c8) = *(long *)(in_RDI + 0x3c8) + local_178;
            uVar11 = kernel::GetBogoSize((CScript *)
                                         CONCAT44(in_stack_fffffffffffffb3c,
                                                  in_stack_fffffffffffffb38));
            *(uint64_t *)(in_RDI + 0x3c0) = uVar11 + *(long *)(in_RDI + 0x3c0);
          }
          Coin::~Coin((Coin *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          local_38c = local_38c + 1;
        }
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        bVar2 = CTransaction::IsCoinBase((CTransaction *)in_stack_fffffffffffffb48);
        if (!bVar2) {
          std::vector<CTxUndo,_std::allocator<CTxUndo>_>::at
                    ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)in_stack_fffffffffffffb48,
                     (size_type)in_stack_fffffffffffffb40);
          local_3a8 = 0;
          while (uVar10 = local_3a8,
                sVar9 = std::vector<Coin,_std::allocator<Coin>_>::size
                                  ((vector<Coin,_std::allocator<Coin>_> *)
                                   CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)),
                uVar10 < sVar9) {
            std::vector<Coin,_std::allocator<Coin>_>::operator[]
                      ((vector<Coin,_std::allocator<Coin>_> *)in_stack_fffffffffffffb48,
                       (size_type)in_stack_fffffffffffffb40);
            Coin::Coin((Coin *)in_stack_fffffffffffffb48,(Coin *)in_stack_fffffffffffffb40);
            std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
            in_stack_fffffffffffffb80 =
                 (pair<uint256,_(anonymous_namespace)::DBVal>_conflict *)
                 std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                           ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffb48,
                            (size_type)in_stack_fffffffffffffb40);
            std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
            std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffb48,
                       (size_type)in_stack_fffffffffffffb40);
            COutPoint::COutPoint
                      ((COutPoint *)in_stack_fffffffffffffb48,(Txid *)in_stack_fffffffffffffb40,
                       in_stack_fffffffffffffb3c);
            kernel::RemoveCoinHash
                      (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                       (Coin *)CONCAT17(in_stack_fffffffffffffb6f,
                                        CONCAT16(in_stack_fffffffffffffb6e,
                                                 CONCAT24(in_stack_fffffffffffffb6c,
                                                          in_stack_fffffffffffffb68))));
            *(long *)(in_RDI + 0x3e0) = *(long *)(in_RDI + 0x3e0) + local_1d0;
            *(long *)(in_RDI + 0x3b8) = *(long *)(in_RDI + 0x3b8) + -1;
            *(long *)(in_RDI + 0x3c8) = *(long *)(in_RDI + 0x3c8) - local_1d0;
            in_stack_fffffffffffffb78 =
                 (MuHash3072 *)
                 kernel::GetBogoSize((CScript *)
                                     CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
            *(long *)(in_RDI + 0x3c0) = *(long *)(in_RDI + 0x3c0) - (long)in_stack_fffffffffffffb78;
            Coin::~Coin((Coin *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
            local_3a8 = local_3a8 + 1;
          }
        }
      }
    }
  }
  lVar12 = (*(long *)(in_RDI + 0x3e0) + *(long *)(in_RDI + 0x3d0)) -
           (*(long *)(in_RDI + 1000) + *(long *)(in_RDI + 0x3f0) + *(long *)(in_RDI + 0x3d8));
  *(long *)(in_RDI + 0x3d8) = *(long *)(in_RDI + 0x3d8) + lVar12;
  *(long *)(in_RDI + 0x410) = *(long *)(in_RDI + 0x410) + lVar12;
  std::pair<uint256,_(anonymous_namespace)::DBVal>::
  pair<uint256,_(anonymous_namespace)::DBVal,_true>
            ((pair<uint256,_(anonymous_namespace)::DBVal>_conflict *)in_stack_fffffffffffffb48);
  uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  MuHash3072::Finalize(in_stack_fffffffffffffb48,(uint256 *)in_stack_fffffffffffffb40);
  value_00 = (pair<uint256,_(anonymous_namespace)::DBVal>_conflict *)
             std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator->
                       ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
                        CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  anon_unknown.dwarf_193474c::DBHeightKey::DBHeightKey
            ((DBHeightKey *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),0);
  local_32d = CDBWrapper::
              Write<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                        ((CDBWrapper *)in_stack_fffffffffffffb80,
                         (DBHeightKey *)in_stack_fffffffffffffb78,value_00,
                         (bool)in_stack_fffffffffffffb6f);
LAB_00f9155a:
  CBlockUndo::~CBlockUndo
            ((CBlockUndo *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  if (*(limb_t *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_32d;
  }
  __stack_chk_fail();
}

Assistant:

bool CoinStatsIndex::CustomAppend(const interfaces::BlockInfo& block)
{
    CBlockUndo block_undo;
    const CAmount block_subsidy{GetBlockSubsidy(block.height, Params().GetConsensus())};
    m_total_subsidy += block_subsidy;

    // Ignore genesis block
    if (block.height > 0) {
        // pindex variable gives indexing code access to node internals. It
        // will be removed in upcoming commit
        const CBlockIndex* pindex = WITH_LOCK(cs_main, return m_chainstate->m_blockman.LookupBlockIndex(block.hash));
        if (!m_chainstate->m_blockman.UndoReadFromDisk(block_undo, *pindex)) {
            return false;
        }

        std::pair<uint256, DBVal> read_out;
        if (!m_db->Read(DBHeightKey(block.height - 1), read_out)) {
            return false;
        }

        uint256 expected_block_hash{*Assert(block.prev_hash)};
        if (read_out.first != expected_block_hash) {
            LogPrintf("WARNING: previous block header belongs to unexpected block %s; expected %s\n",
                      read_out.first.ToString(), expected_block_hash.ToString());

            if (!m_db->Read(DBHashKey(expected_block_hash), read_out)) {
                LogError("%s: previous block header not found; expected %s\n",
                             __func__, expected_block_hash.ToString());
                return false;
            }
        }

        // Add the new utxos created from the block
        assert(block.data);
        for (size_t i = 0; i < block.data->vtx.size(); ++i) {
            const auto& tx{block.data->vtx.at(i)};

            // Skip duplicate txid coinbase transactions (BIP30).
            if (IsBIP30Unspendable(*pindex) && tx->IsCoinBase()) {
                m_total_unspendable_amount += block_subsidy;
                m_total_unspendables_bip30 += block_subsidy;
                continue;
            }

            for (uint32_t j = 0; j < tx->vout.size(); ++j) {
                const CTxOut& out{tx->vout[j]};
                Coin coin{out, block.height, tx->IsCoinBase()};
                COutPoint outpoint{tx->GetHash(), j};

                // Skip unspendable coins
                if (coin.out.scriptPubKey.IsUnspendable()) {
                    m_total_unspendable_amount += coin.out.nValue;
                    m_total_unspendables_scripts += coin.out.nValue;
                    continue;
                }

                ApplyCoinHash(m_muhash, outpoint, coin);

                if (tx->IsCoinBase()) {
                    m_total_coinbase_amount += coin.out.nValue;
                } else {
                    m_total_new_outputs_ex_coinbase_amount += coin.out.nValue;
                }

                ++m_transaction_output_count;
                m_total_amount += coin.out.nValue;
                m_bogo_size += GetBogoSize(coin.out.scriptPubKey);
            }

            // The coinbase tx has no undo data since no former output is spent
            if (!tx->IsCoinBase()) {
                const auto& tx_undo{block_undo.vtxundo.at(i - 1)};

                for (size_t j = 0; j < tx_undo.vprevout.size(); ++j) {
                    Coin coin{tx_undo.vprevout[j]};
                    COutPoint outpoint{tx->vin[j].prevout.hash, tx->vin[j].prevout.n};

                    RemoveCoinHash(m_muhash, outpoint, coin);

                    m_total_prevout_spent_amount += coin.out.nValue;

                    --m_transaction_output_count;
                    m_total_amount -= coin.out.nValue;
                    m_bogo_size -= GetBogoSize(coin.out.scriptPubKey);
                }
            }
        }
    } else {
        // genesis block
        m_total_unspendable_amount += block_subsidy;
        m_total_unspendables_genesis_block += block_subsidy;
    }

    // If spent prevouts + block subsidy are still a higher amount than
    // new outputs + coinbase + current unspendable amount this means
    // the miner did not claim the full block reward. Unclaimed block
    // rewards are also unspendable.
    const CAmount unclaimed_rewards{(m_total_prevout_spent_amount + m_total_subsidy) - (m_total_new_outputs_ex_coinbase_amount + m_total_coinbase_amount + m_total_unspendable_amount)};
    m_total_unspendable_amount += unclaimed_rewards;
    m_total_unspendables_unclaimed_rewards += unclaimed_rewards;

    std::pair<uint256, DBVal> value;
    value.first = block.hash;
    value.second.transaction_output_count = m_transaction_output_count;
    value.second.bogo_size = m_bogo_size;
    value.second.total_amount = m_total_amount;
    value.second.total_subsidy = m_total_subsidy;
    value.second.total_unspendable_amount = m_total_unspendable_amount;
    value.second.total_prevout_spent_amount = m_total_prevout_spent_amount;
    value.second.total_new_outputs_ex_coinbase_amount = m_total_new_outputs_ex_coinbase_amount;
    value.second.total_coinbase_amount = m_total_coinbase_amount;
    value.second.total_unspendables_genesis_block = m_total_unspendables_genesis_block;
    value.second.total_unspendables_bip30 = m_total_unspendables_bip30;
    value.second.total_unspendables_scripts = m_total_unspendables_scripts;
    value.second.total_unspendables_unclaimed_rewards = m_total_unspendables_unclaimed_rewards;

    uint256 out;
    m_muhash.Finalize(out);
    value.second.muhash = out;

    // Intentionally do not update DB_MUHASH here so it stays in sync with
    // DB_BEST_BLOCK, and the index is not corrupted if there is an unclean shutdown.
    return m_db->Write(DBHeightKey(block.height), value);
}